

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

void __thiscall implementations::scheme::SchemeFrame::execute(SchemeFrame *this)

{
  bool bVar1;
  uint uVar2;
  runtime_error *this_00;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  local_88 [3];
  SubframeMode local_6c;
  undefined1 local_68 [4];
  SubframeMode mode;
  cell res;
  SchemeFrame *this_local;
  
  res.env.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  uVar2 = (*(this->
            super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
            )._vptr_Frame[2])();
  if ((uVar2 & 1) == 0) {
    if (this->subframe == (SchemeFrame *)0x0) {
      local_88[0]._M_current =
           (cell *)std::
                   vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                   ::cend(&this->arguments);
      bVar1 = __gnu_cxx::operator==(&this->arg_it,local_88);
      if (bVar1) {
        dispatch(this);
      }
      else {
        nextArgument(this);
      }
    }
    else {
      execute(this->subframe);
      uVar2 = (*(this->subframe->
                super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                )._vptr_Frame[2])();
      if ((uVar2 & 1) != 0) {
        cell::cell((cell *)local_68,
                   &(this->subframe->
                    super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                    ).result);
        local_6c = this->subframe_mode;
        if (this->subframe != (SchemeFrame *)0x0) {
          (*(this->subframe->
            super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
            )._vptr_Frame[1])();
        }
        this->subframe = (SchemeFrame *)0x0;
        this->subframe_mode = None;
        if (local_6c == Argument) {
          std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ::push_back(&this->resolved_arguments,(value_type *)local_68);
          __gnu_cxx::
          __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
          ::operator++(&this->arg_it);
          nextArgument(this);
        }
        else {
          if (local_6c != Procedure) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Invalid subframe mode None");
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          cell::operator=(&(this->
                           super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                           ).result,(cell *)local_68);
          nextExpression(this);
        }
        cell::~cell((cell *)local_68);
      }
    }
  }
  return;
}

Assistant:

void execute() {
		if (isResolved())
			return;
		if (subframe != nullptr) {
			subframe->execute();
			if (subframe->isResolved()) {
				// Copy results
				cell res(subframe->result);
				auto mode = subframe_mode;
				DEBUG("  subframe(" + std::string((mode == Argument ? "arg" : "proc")) + ") = " + to_string(res));
				// Clear subframe
				delete subframe;
				subframe = nullptr;
				subframe_mode = None;
				// Do something with result
				switch (mode) {
				case Argument:
					resolved_arguments.push_back(res);
					++arg_it;
					nextArgument();
					break;
				case Procedure:
					result = res;
					nextExpression();
					break;
				default:
					throw std::runtime_error("Invalid subframe mode None");
				}
			}
		}  else if (arg_it == arguments.cend())
			dispatch();
		else
			nextArgument();
	}